

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

bool __thiscall mjs::object::can_put(object *this,wstring_view *name)

{
  bool bVar1;
  property_attribute a;
  
  while( true ) {
    a = (*this->_vptr_object[6])(this,name);
    bVar1 = is_valid(a);
    if (bVar1) {
      bVar1 = has_attributes(a,read_only);
      return !bVar1;
    }
    if ((this->prototype_).pos_ == 0) break;
    this = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->prototype_,this->heap_);
  }
  return this->extensible_;
}

Assistant:

bool object::can_put(const std::wstring_view& name) const {
    auto a = own_property_attributes(name);
    if (is_valid(a)) {
        return !has_attributes(a, property_attribute::read_only);
    }
    if (!prototype_) {
        return extensible_;
    }
    return prototype_.dereference(heap()).can_put(name);
}